

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_map.cpp
# Opt level: O1

void __thiscall CDoodadsMapper::AnalyzeGameLayer(CDoodadsMapper *this)

{
  array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
  *this_00;
  array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
  *this_01;
  array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
  *this_02;
  CLayerGame *pCVar1;
  CTile *pCVar2;
  int iVar3;
  int iVar4;
  array<int,_allocator_default<int>_> *paVar5;
  array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
  *this_03;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  long lVar12;
  bool bVar13;
  long in_FS_OFFSET;
  array<int,_allocator_default<int>_> aChain;
  int local_8c;
  int local_78;
  int local_74;
  int local_4c;
  array<int,_allocator_default<int>_> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->m_FloorIDs;
  allocator_default<array<int,_allocator_default<int>_>_>::free_array((this->m_FloorIDs).list);
  (this->m_FloorIDs).list_size = 1;
  paVar5 = allocator_default<array<int,_allocator_default<int>_>_>::alloc_array(1);
  (this->m_FloorIDs).list = paVar5;
  (this->m_FloorIDs).num_elements = 0;
  this_01 = &this->m_CeilingIDs;
  allocator_default<array<int,_allocator_default<int>_>_>::free_array((this->m_CeilingIDs).list);
  (this->m_CeilingIDs).list_size = 1;
  paVar5 = allocator_default<array<int,_allocator_default<int>_>_>::alloc_array(1);
  (this->m_CeilingIDs).list = paVar5;
  (this->m_CeilingIDs).num_elements = 0;
  allocator_default<array<int,_allocator_default<int>_>_>::free_array((this->m_RightWallIDs).list);
  (this->m_RightWallIDs).list_size = 1;
  paVar5 = allocator_default<array<int,_allocator_default<int>_>_>::alloc_array(1);
  (this->m_RightWallIDs).list = paVar5;
  (this->m_RightWallIDs).num_elements = 0;
  allocator_default<array<int,_allocator_default<int>_>_>::free_array((this->m_LeftWallIDs).list);
  (this->m_LeftWallIDs).list_size = 1;
  paVar5 = allocator_default<array<int,_allocator_default<int>_>_>::alloc_array(1);
  iVar9 = 1;
  (this->m_LeftWallIDs).list = paVar5;
  iVar10 = 0;
  (this->m_LeftWallIDs).num_elements = 0;
  pCVar1 = (((this->super_IAutoMapper).m_pEditor)->m_Map).m_pGameLayer;
  if (2 < (pCVar1->super_CLayerTiles).m_Height) {
    local_8c = 2;
    iVar6 = 0;
    iVar4 = 0;
    do {
      iVar3 = (pCVar1->super_CLayerTiles).m_Width;
      if (2 < iVar3) {
        lVar8 = 1;
        bVar11 = false;
        bVar13 = false;
        do {
          pCVar2 = (pCVar1->super_CLayerTiles).m_pTiles;
          lVar12 = iVar9 * iVar3 + lVar8;
          if (pCVar2[lVar12].m_Index == '\0') {
            bVar11 = false;
            bVar13 = false;
          }
          else {
            iVar7 = (int)lVar8;
            if ((pCVar2[lVar12].m_Index == '\x01') &&
               ((byte)(pCVar2[iVar3 * iVar10 + iVar7].m_Index + 0x40) < 0x41)) {
              if (bVar11) {
                local_48.list = (int *)CONCAT44(local_48.list._4_4_,iVar9 * iVar3 + iVar7);
                array<int,_allocator_default<int>_>::add(this_00->list + iVar4,(int *)&local_48);
              }
              else {
                local_48.list = (int *)0x0;
                local_48.list_size = 1;
                local_48.list = (int *)operator_new__(4);
                local_48.num_elements = 0;
                local_4c = (pCVar1->super_CLayerTiles).m_Width * iVar9 + iVar7;
                array<int,_allocator_default<int>_>::add(&local_48,&local_4c);
                iVar4 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                        ::add(this_00,&local_48);
                if (local_48.list != (int *)0x0) {
                  operator_delete__(local_48.list);
                }
                bVar11 = true;
              }
            }
            else {
              bVar11 = false;
            }
            if ((pCVar2[lVar12].m_Index == '\x01') &&
               (iVar3 = (pCVar1->super_CLayerTiles).m_Width,
               (byte)((pCVar1->super_CLayerTiles).m_pTiles[local_8c * iVar3 + lVar8].m_Index + 0x40)
               < 0x41)) {
              if (bVar13) {
                local_48.list = (int *)CONCAT44(local_48.list._4_4_,iVar3 * iVar9 + iVar7);
                array<int,_allocator_default<int>_>::add(this_01->list + iVar6,(int *)&local_48);
              }
              else {
                local_48.list = (int *)0x0;
                local_48.list_size = 1;
                local_48.list = (int *)operator_new__(4);
                local_48.num_elements = 0;
                local_4c = (pCVar1->super_CLayerTiles).m_Width * iVar9 + iVar7;
                array<int,_allocator_default<int>_>::add(&local_48,&local_4c);
                iVar6 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                        ::add(this_01,&local_48);
                if (local_48.list != (int *)0x0) {
                  operator_delete__(local_48.list);
                }
                bVar13 = true;
              }
            }
            else {
              bVar13 = false;
            }
          }
          iVar3 = (pCVar1->super_CLayerTiles).m_Width;
          lVar8 = lVar8 + 1;
        } while ((int)lVar8 < iVar3 + -1);
      }
      iVar9 = iVar9 + 1;
      local_8c = local_8c + 1;
      iVar10 = iVar10 + 1;
    } while (iVar9 < (pCVar1->super_CLayerTiles).m_Height + -1);
  }
  this_02 = &this->m_RightWallIDs;
  this_03 = &this->m_LeftWallIDs;
  if (2 < (pCVar1->super_CLayerTiles).m_Width) {
    local_78 = 0;
    iVar10 = 1;
    local_74 = 0;
    do {
      if (2 < (pCVar1->super_CLayerTiles).m_Height) {
        iVar9 = 1;
        bVar13 = false;
        bVar11 = false;
        do {
          pCVar2 = (pCVar1->super_CLayerTiles).m_pTiles;
          iVar6 = (pCVar1->super_CLayerTiles).m_Width * iVar9;
          iVar4 = iVar6 + iVar10;
          if (pCVar2[iVar4].m_Index == '\0') {
            bVar11 = false;
            bVar13 = false;
          }
          else {
            if ((pCVar2[iVar4].m_Index == '\x01') &&
               ((byte)(pCVar2[iVar6 + iVar10 + 1].m_Index + 0x40) < 0x41)) {
              if (bVar11) {
                local_48.list = (int *)CONCAT44(local_48.list._4_4_,iVar4);
                array<int,_allocator_default<int>_>::add(this_02->list + local_74,(int *)&local_48);
              }
              else {
                local_48.list = (int *)0x0;
                local_48.list_size = 1;
                local_48.list = (int *)operator_new__(4);
                local_48.num_elements = 0;
                local_4c = (pCVar1->super_CLayerTiles).m_Width * iVar9 + iVar10;
                array<int,_allocator_default<int>_>::add(&local_48,&local_4c);
                local_74 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                           ::add(this_02,&local_48);
                if (local_48.list != (int *)0x0) {
                  operator_delete__(local_48.list);
                }
                bVar11 = true;
              }
            }
            else {
              bVar11 = false;
            }
            if ((pCVar2[iVar4].m_Index == '\x01') &&
               (iVar4 = (pCVar1->super_CLayerTiles).m_Width * iVar9,
               (byte)((pCVar1->super_CLayerTiles).m_pTiles[iVar10 + -1 + iVar4].m_Index + 0x40) <
               0x41)) {
              if (bVar13) {
                local_48.list = (int *)CONCAT44(local_48.list._4_4_,iVar4 + iVar10);
                array<int,_allocator_default<int>_>::add(this_03->list + local_78,(int *)&local_48);
              }
              else {
                local_48.list = (int *)0x0;
                local_48.list_size = 1;
                local_48.list = (int *)operator_new__(4);
                local_48.num_elements = 0;
                local_4c = (pCVar1->super_CLayerTiles).m_Width * iVar9 + iVar10;
                array<int,_allocator_default<int>_>::add(&local_48,&local_4c);
                local_78 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                           ::add(this_03,&local_48);
                if (local_48.list != (int *)0x0) {
                  operator_delete__(local_48.list);
                }
                bVar13 = true;
              }
            }
            else {
              bVar13 = false;
            }
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 < (pCVar1->super_CLayerTiles).m_Height + -1);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < (pCVar1->super_CLayerTiles).m_Width + -1);
  }
  if (0 < (this->m_FloorIDs).num_elements) {
    iVar10 = 0;
    do {
      if (this_00->list[iVar10].num_elements < 3) {
        array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
        ::remove_index_fast(this_00,iVar10);
        iVar10 = iVar10 + -1;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < (this->m_FloorIDs).num_elements);
  }
  if (0 < (this->m_CeilingIDs).num_elements) {
    iVar10 = 0;
    do {
      if (this_01->list[iVar10].num_elements < 3) {
        array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
        ::remove_index_fast(this_01,iVar10);
        iVar10 = iVar10 + -1;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < (this->m_CeilingIDs).num_elements);
  }
  if (0 < (this->m_RightWallIDs).num_elements) {
    iVar10 = 0;
    do {
      if (this_02->list[iVar10].num_elements < 3) {
        array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
        ::remove_index_fast(this_02,iVar10);
        iVar10 = iVar10 + -1;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < (this->m_RightWallIDs).num_elements);
  }
  if (0 < (this->m_LeftWallIDs).num_elements) {
    iVar10 = 0;
    do {
      if (this_03->list[iVar10].num_elements < 3) {
        array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
        ::remove_index_fast(this_03,iVar10);
        iVar10 = iVar10 + -1;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < (this->m_LeftWallIDs).num_elements);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CDoodadsMapper::AnalyzeGameLayer()
{
	// the purpose of this is to detect game layer collision's edges to place doodads according to them

	// clear existing edges
	m_FloorIDs.clear();
	m_CeilingIDs.clear();
	m_RightWallIDs.clear();
	m_LeftWallIDs.clear();

	CLayerGame *pLayer = m_pEditor->m_Map.m_pGameLayer;

	bool FloorKeepChaining = false;
	bool CeilingKeepChaining = false;
	int FloorChainID = 0;
	int CeilingChainID = 0;

	// floors and ceilings
	// browse up to down
	for(int y = 1; y < pLayer->m_Height-1; y++)
	{
		FloorKeepChaining = false;
		CeilingKeepChaining = false;

		for(int x = 1; x < pLayer->m_Width-1; x++)
		{
			CTile *pTile = &(pLayer->m_pTiles[y*pLayer->m_Width+x]);

			// empty, skip
			if(pTile->m_Index == 0)
			{
				FloorKeepChaining = false;
				CeilingKeepChaining = false;
				continue;
			}

			// check up
			int CheckIndex = (y-1)*pLayer->m_Width+x;

			// add a floor part
			if(pTile->m_Index == 1 && (pLayer->m_pTiles[CheckIndex].m_Index == 0 || pLayer->m_pTiles[CheckIndex].m_Index > ENTITY_OFFSET))
			{
				// create an new chain
				if(!FloorKeepChaining)
				{
					array<int> aChain;
					aChain.add(y*pLayer->m_Width+x);
					FloorChainID = m_FloorIDs.add(aChain);
					FloorKeepChaining = true;
				}
				else
				{
					// keep chaining
					m_FloorIDs[FloorChainID].add(y*pLayer->m_Width+x);
				}
			}
			else
				FloorKeepChaining = false;

			// check down
			CheckIndex = (y+1)*pLayer->m_Width+x;

			// add a ceiling part
			if(pTile->m_Index == 1 && (pLayer->m_pTiles[CheckIndex].m_Index == 0 || pLayer->m_pTiles[CheckIndex].m_Index > ENTITY_OFFSET))
			{
				// create an new chain
				if(!CeilingKeepChaining)
				{
					array<int> aChain;
					aChain.add(y*pLayer->m_Width+x);
					CeilingChainID = m_CeilingIDs.add(aChain);
					CeilingKeepChaining = true;
				}
				else
				{
					// keep chaining
					m_CeilingIDs[CeilingChainID].add(y*pLayer->m_Width+x);
				}
			}
			else
				CeilingKeepChaining = false;
		}
	}

	bool RWallKeepChaining = false;
	bool LWallKeepChaining = false;
	int RWallChainID = 0;
	int LWallChainID = 0;

	// walls
	// browse left to right
	for(int x = 1; x < pLayer->m_Width-1; x++)
	{
		RWallKeepChaining = false;
		LWallKeepChaining = false;

		for(int y = 1; y < pLayer->m_Height-1; y++)
		{
			CTile *pTile = &(pLayer->m_pTiles[y*pLayer->m_Width+x]);

			if(pTile->m_Index == 0)
			{
				RWallKeepChaining = false;
				LWallKeepChaining = false;
				continue;
			}

			// check right
			int CheckIndex = y*pLayer->m_Width+(x+1);

			// add a right wall part
			if(pTile->m_Index == 1 && (pLayer->m_pTiles[CheckIndex].m_Index == 0 || pLayer->m_pTiles[CheckIndex].m_Index > ENTITY_OFFSET))
			{
				// create an new chain
				if(!RWallKeepChaining)
				{
					array<int> aChain;
					aChain.add(y*pLayer->m_Width+x);
					RWallChainID = m_RightWallIDs.add(aChain);
					RWallKeepChaining = true;
				}
				else
				{
					// keep chaining
					m_RightWallIDs[RWallChainID].add(y*pLayer->m_Width+x);
				}
			}
			else
				RWallKeepChaining = false;

			// check left
			CheckIndex = y*pLayer->m_Width+(x-1);

			// add a left wall part
			if(pTile->m_Index == 1 && (pLayer->m_pTiles[CheckIndex].m_Index == 0 || pLayer->m_pTiles[CheckIndex].m_Index > ENTITY_OFFSET))
			{
				// create an new chain
				if(!LWallKeepChaining)
				{
					array<int> aChain;
					aChain.add(y*pLayer->m_Width+x);
					LWallChainID = m_LeftWallIDs.add(aChain);
					LWallKeepChaining = true;
				}
				else
				{
					// keep chaining
					m_LeftWallIDs[LWallChainID].add(y*pLayer->m_Width+x);
				}
			}
			else
				LWallKeepChaining = false;
		}
	}

	// clean up too small chains
	for(int i = 0; i < m_FloorIDs.size(); i++)
	{
		if(m_FloorIDs[i].size() < 3)
		{
			m_FloorIDs.remove_index_fast(i);
			i--;
		}
	}

	for(int i = 0; i < m_CeilingIDs.size(); i++)
	{
		if(m_CeilingIDs[i].size() < 3)
		{
			m_CeilingIDs.remove_index_fast(i);
			i--;
		}
	}

	for(int i = 0; i < m_RightWallIDs.size(); i++)
	{
		if(m_RightWallIDs[i].size() < 3)
		{
			m_RightWallIDs.remove_index_fast(i);
			i--;
		}
	}

	for(int i = 0; i < m_LeftWallIDs.size(); i++)
	{
		if(m_LeftWallIDs[i].size() < 3)
		{
			m_LeftWallIDs.remove_index_fast(i);
			i--;
		}
	}
}